

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall kratos::DPIVisitor::visit(DPIVisitor *this,FunctionStmtBlock *stmt)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  *this_01;
  pointer pcVar1;
  element_type *peVar2;
  long lVar3;
  pointer __s1;
  pointer puVar4;
  int iVar5;
  iterator iVar6;
  mapped_type *ppDVar7;
  const_iterator cVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  StmtException *pSVar11;
  long *plVar12;
  VarException *pVVar13;
  DPIFunctionStmtBlock *pDVar14;
  size_t __n;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<kratos::IRNode_*> __l_01;
  initializer_list<kratos::IRNode_*> __l_02;
  FunctionStmtBlock *local_e8;
  mapped_type local_e0;
  _Rb_tree_node_base *local_d8;
  _Base_ptr local_d0;
  long local_c8;
  mapped_type local_c0;
  FunctionStmtBlock *local_b8;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_b0;
  key_type local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [39];
  allocator_type local_31;
  
  iVar5 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xf])(stmt);
  if ((char)iVar5 != '\0') {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    pcVar1 = (stmt->function_name_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar1,pcVar1 + (stmt->function_name_)._M_string_length);
    this_00 = &this->dpi_funcs_;
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>_>
            ::find(&this_00->_M_t,&local_98);
    if ((_Rb_tree_header *)iVar6._M_node == &(this->dpi_funcs_)._M_t._M_impl.super__Rb_tree_header)
    {
      local_58._0_8_ =
           __dynamic_cast(stmt,&FunctionStmtBlock::typeinfo,&DPIFunctionStmtBlock::typeinfo,0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::DPIFunctionStmtBlock*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::DPIFunctionStmtBlock*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::DPIFunctionStmtBlock*>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,kratos::DPIFunctionStmtBlock*>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::DPIFunctionStmtBlock*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::DPIFunctionStmtBlock*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::DPIFunctionStmtBlock*>>>
                  *)this_00,&local_98,(DPIFunctionStmtBlock **)local_58);
    }
    else {
      ppDVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>_>
                ::at(this_00,&local_98);
      local_e0 = *ppDVar7;
      if ((local_e0->super_FunctionStmtBlock).ports_._M_t._M_impl.super__Rb_tree_header.
          _M_node_count != (stmt->ports_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        pSVar11 = (StmtException *)__cxa_allocate_exception(0x10);
        std::operator+(&local_78,"DPI function ",&local_98);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_58._0_8_ = *plVar12;
        pDVar14 = (DPIFunctionStmtBlock *)(plVar12 + 2);
        if ((DPIFunctionStmtBlock *)local_58._0_8_ == pDVar14) {
          local_58._16_8_ =
               (pDVar14->super_FunctionStmtBlock).super_StmtBlock.super_Stmt.super_IRNode.
               _vptr_IRNode;
          local_58._24_8_ = plVar12[3];
          local_58._0_8_ = (DPIFunctionStmtBlock *)(local_58 + 0x10);
        }
        else {
          local_58._16_8_ =
               (pDVar14->super_FunctionStmtBlock).super_StmtBlock.super_Stmt.super_IRNode.
               _vptr_IRNode;
        }
        local_58._8_8_ = plVar12[1];
        *plVar12 = (long)pDVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        __l_02._M_len = 2;
        __l_02._M_array = (iterator)&local_e8;
        local_e8 = stmt;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_b0,__l_02,&local_31);
        StmtException::StmtException(pSVar11,(string *)local_58,&local_b0);
        __cxa_throw(pSVar11,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
      local_b8 = stmt;
      local_c8 = __dynamic_cast(stmt,&FunctionStmtBlock::typeinfo,&DPIFunctionStmtBlock::typeinfo,0)
      ;
      p_Var10 = (local_e0->super_FunctionStmtBlock).ports_._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      local_d8 = &(local_e0->super_FunctionStmtBlock).ports_._M_t._M_impl.super__Rb_tree_header.
                  _M_header;
      local_c0 = local_e0;
      if (p_Var10 != local_d8) {
        this_01 = &local_b8->ports_;
        local_d0 = &(local_b8->ports_)._M_t._M_impl.super__Rb_tree_header._M_header;
        do {
          cVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                  ::find(&this_01->_M_t,(key_type *)(p_Var10 + 1));
          if (cVar8._M_node == local_d0) {
            pVVar13 = (VarException *)__cxa_allocate_exception(0x10);
            local_78._M_dataplus._M_p = local_98._M_dataplus._M_p;
            local_78._M_string_length = local_98._M_string_length;
            format_str_00.size_ = 0xd;
            format_str_00.data_ = (char *)0x3e;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_78;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)local_58,
                       (detail *)"DPI function with the same name ({0}) have different interface",
                       format_str_00,args_00);
            local_b0.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl
            .super__Vector_impl_data._M_start = *(pointer *)(p_Var10 + 2);
            __l_00._M_len = 1;
            __l_00._M_array = (iterator)&local_b0;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &local_78,__l_00,(allocator_type *)&local_e8);
            VarException::VarException
                      (pVVar13,(string *)local_58,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &local_78);
            __cxa_throw(pVVar13,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                   ::at(this_01,(key_type *)(p_Var10 + 1));
          peVar2 = (pmVar9->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          lVar3 = *(long *)(p_Var10 + 2);
          __s1 = (peVar2->super_Var).size_.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
          puVar4 = (peVar2->super_Var).size_.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          __n = (long)puVar4 - (long)__s1;
          if (__n != *(long *)(lVar3 + 0xa8) - (long)*(void **)(lVar3 + 0xa0)) {
LAB_0021949f:
            pVVar13 = (VarException *)__cxa_allocate_exception(0x10);
            local_78._M_dataplus._M_p = local_98._M_dataplus._M_p;
            local_78._M_string_length = local_98._M_string_length;
            format_str.size_ = 0xd;
            format_str.data_ = (char *)0x3e;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_78;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)local_58,
                       (detail *)"DPI function with the same name ({0}) have different interface",
                       format_str,args);
            local_b0.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl
            .super__Vector_impl_data._M_start = *(pointer *)(p_Var10 + 2);
            local_b0.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl
            .super__Vector_impl_data._M_finish =
                 (pointer)(pmVar9->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr;
            __l._M_len = 2;
            __l._M_array = (iterator)&local_b0;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &local_78,__l,(allocator_type *)&local_e8);
            VarException::VarException
                      (pVVar13,(string *)local_58,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &local_78);
            __cxa_throw(pVVar13,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
          if (puVar4 != __s1) {
            iVar5 = bcmp(__s1,*(void **)(lVar3 + 0xa0),__n);
            if (iVar5 != 0) goto LAB_0021949f;
          }
          if (((peVar2->super_Var).is_signed_ != (bool)*(char *)(lVar3 + 0xf0)) ||
             (peVar2->direction_ != *(PortDirection *)(lVar3 + 0x270))) goto LAB_0021949f;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while (p_Var10 != local_d8);
      }
      if (((bool)*(char *)(local_c8 + 0x184) != local_c0->is_context_) ||
         ((bool)*(char *)(local_c8 + 0x185) != local_c0->is_pure_)) {
        pSVar11 = (StmtException *)__cxa_allocate_exception(0x10);
        std::operator+(&local_78,"DPI function ",&local_98);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_58._0_8_ = *plVar12;
        pDVar14 = (DPIFunctionStmtBlock *)(plVar12 + 2);
        if ((DPIFunctionStmtBlock *)local_58._0_8_ == pDVar14) {
          local_58._16_8_ =
               (pDVar14->super_FunctionStmtBlock).super_StmtBlock.super_Stmt.super_IRNode.
               _vptr_IRNode;
          local_58._24_8_ = plVar12[3];
          local_58._0_8_ = (DPIFunctionStmtBlock *)(local_58 + 0x10);
        }
        else {
          local_58._16_8_ =
               (pDVar14->super_FunctionStmtBlock).super_StmtBlock.super_Stmt.super_IRNode.
               _vptr_IRNode;
        }
        local_58._8_8_ = plVar12[1];
        *plVar12 = (long)pDVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        local_e8 = local_b8;
        local_e0 = local_c0;
        __l_01._M_len = 2;
        __l_01._M_array = (iterator)&local_e8;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_b0,__l_01,&local_31);
        StmtException::StmtException(pSVar11,(string *)local_58,&local_b0);
        __cxa_throw(pSVar11,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void visit(FunctionStmtBlock* stmt) override {
        if (!stmt->is_dpi()) return;
        // collect all the dpi information and then make sure they are declared in the same
        // name and spec
        // this can be an issue if the files are going to split into multiple files
        auto const& func_name = stmt->function_name();
        if (dpi_funcs_.find(func_name) == dpi_funcs_.end()) {
            // new one
            dpi_funcs_.emplace(func_name, dynamic_cast<DPIFunctionStmtBlock*>(stmt));
        } else {
            auto* ref_stmt = dpi_funcs_.at(func_name);
            auto const& ref_ports = ref_stmt->ports();
            auto const& ports = stmt->ports();
            if (ref_ports.size() != ports.size())
                throw StmtException("DPI function " + func_name + " has different interface",
                                    {stmt, ref_stmt});
            // check the return width
            auto* dpi_stmt = dynamic_cast<DPIFunctionStmtBlock*>(stmt);
            if (dpi_stmt->return_width() != ref_stmt->return_width()) {
                if (ref_ports.size() != ports.size())
                    throw StmtException("DPI function " + func_name + " has different interface",
                                        {stmt, ref_stmt});
            }
            for (auto const& [port_name, port_ref] : ref_ports) {
                if (ports.find(port_name) == ports.end()) {
                    throw VarException(
                        ::format("DPI function with the same name ({0}) have different interface",
                                 func_name),
                        {port_ref.get()});
                }
                auto const& port = ports.at(port_name);
                if (port->size() != port_ref->size() ||
                    port->is_signed() != port_ref->is_signed() ||
                    port->port_direction() != port_ref->port_direction()) {
                    throw VarException(
                        ::format("DPI function with the same name ({0}) have different interface",
                                 func_name),
                        {port_ref.get(), port.get()});
                }
            }
            if (dpi_stmt->is_context() != ref_stmt->is_context() ||
                dpi_stmt->is_pure() != ref_stmt->is_pure())
                throw StmtException(
                    "DPI function " + func_name + " has different attribute (pure/context)",
                    {stmt, ref_stmt});
        }
    }